

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O1

void __thiscall
leveldb::Harness_RandomizedLongDB_Test::~Harness_RandomizedLongDB_Test
          (Harness_RandomizedLongDB_Test *this)

{
  Constructor *pCVar1;
  
  (this->super_Harness).super_Test._vptr_Test = (_func_int **)&PTR__Harness_0017e0a8;
  pCVar1 = (this->super_Harness).constructor_;
  if (pCVar1 != (Constructor *)0x0) {
    (*pCVar1->_vptr_Constructor[1])();
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(Harness, RandomizedLongDB) {
  Random rnd(test::RandomSeed());
  TestArgs args = {DB_TEST, false, 16};
  Init(args);
  int num_entries = 100000;
  for (int e = 0; e < num_entries; e++) {
    std::string v;
    Add(test::RandomKey(&rnd, rnd.Skewed(4)),
        test::RandomString(&rnd, rnd.Skewed(5), &v).ToString());
  }
  Test(&rnd);

  // We must have created enough data to force merging
  int files = 0;
  for (int level = 0; level < config::kNumLevels; level++) {
    std::string value;
    char name[100];
    std::snprintf(name, sizeof(name), "leveldb.num-files-at-level%d", level);
    ASSERT_TRUE(db()->GetProperty(name, &value));
    files += atoi(value.c_str());
  }
  ASSERT_GT(files, 0);
}